

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O2

void fill_simple_vertices(ALLEGRO_CONFIG *cfg,char *name)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  float y;
  float x;
  char buf [80];
  
  memset(simple_vertices,0,800);
  uVar3 = 0;
  while( true ) {
    if (uVar3 == 100) {
      num_simple_vertices = 100;
      return;
    }
    sprintf(buf,"v%d",uVar3 & 0xffffffff);
    lVar2 = al_get_config_value(cfg,name,buf);
    if (lVar2 == 0) break;
    iVar1 = __isoc99_sscanf(lVar2," %f , %f",&x,&y);
    if (iVar1 == 2) {
      simple_vertices[uVar3 * 2] = x;
      simple_vertices[uVar3 * 2 + 1] = y;
    }
    uVar3 = uVar3 + 1;
  }
  num_simple_vertices = (int)uVar3;
  return;
}

Assistant:

static void fill_simple_vertices(ALLEGRO_CONFIG const *cfg, char const *name)
{
#define MAXBUF    80

   char const *value;
   char buf[MAXBUF];
   float x, y;
   int i;

   memset(simple_vertices, 0, sizeof(simple_vertices));

   for (i = 0; i < MAX_VERTICES; i++) {
      sprintf(buf, "v%d", i);
      value = al_get_config_value(cfg, name, buf);
      if (!value)
         break;

      if (sscanf(value, " %f , %f", &x, &y) == 2) {
         simple_vertices[2*i + 0] = x;
         simple_vertices[2*i + 1] = y;
      }
   }

   num_simple_vertices = i;

#undef MAXBUF
}